

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

error assemble_predicate(token *token,opcode *op,size_t shift,int is_negable)

{
  bool bVar1;
  int in_R8D;
  uint64_t bits;
  int is_negable_local;
  size_t shift_local;
  opcode *op_local;
  token *token_local;
  error *tmpres___LINE__;
  
  confirm_type(token,(token_type)op);
  bVar1 = error::operator_cast_to_bool((error *)token);
  if (!bVar1) {
    error::~error((error *)token);
    if ((in_R8D == 0) && ((op->sched).raw != 0)) {
      fail(token,(char *)op,"predicate can\'t be negated");
    }
    else {
      opcode::add_bits((opcode *)shift,
                       (long)(int)((uint)((op->sched).raw != 0) << 3 | op->reuse) <<
                       ((byte)is_negable & 0x3f));
      memset(token,0,8);
      error::error((error *)token);
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

static error assemble_predicate(const token& token, opcode& op, size_t shift, int is_negable)
{
    CHECK(confirm_type(token, token_type::predicate));

    if (!is_negable && token.data.predicate.negated) {
        return fail(token, "predicate can't be negated");
    }
    uint64_t bits = token.data.predicate.index;
    bits |= (token.data.predicate.negated ? 1 : 0) << 3;
    bits <<= shift;
    op.add_bits(bits);
    return {};
}